

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  _Alloc_hider _Var7;
  char cVar8;
  byte bVar9;
  int iVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pointer pcVar11;
  ostream *poVar12;
  shared_ptr<SchemeObject> *unaff_R14;
  size_type __dnew;
  string local_120;
  string local_100;
  long *local_e0 [2];
  long local_d0 [2];
  undefined1 local_c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  long local_a0 [2];
  undefined1 local_90 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  long local_60 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  bVar9 = 1;
  if (scheme_true.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      scheme_false.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
    unaff_R14 = &scheme_false;
    iVar10 = (*(scheme_true.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               _vptr_SchemeObject[6])
                       (scheme_true.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,&scheme_false);
    if ((char)iVar10 == '\0') {
      iVar10 = (*(scheme_false.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->_vptr_SchemeObject[6])
                         (scheme_false.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,&scheme_true);
      if ((char)iVar10 == '\0') {
        local_70._M_allocated_capacity = (size_type)local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"#t","");
        evaluate_string_in_global_context((string *)(local_90 + 0x10));
        if ((element_type *)local_90._16_8_ ==
            scheme_true.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
          local_b0._M_allocated_capacity = (size_type)local_a0;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_c0 + 0x10),"#f","");
          evaluate_string_in_global_context((string *)local_90);
          if ((element_type *)local_90._0_8_ !=
              scheme_false.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
            bVar5 = true;
            goto LAB_00116b93;
          }
          unaff_R14 = (shared_ptr<SchemeObject> *)operator_new(0x20);
          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14)->_M_use_count)->_M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
          ((__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> *)
          &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14)->_vptr__Sp_counted_base)->
          _M_ptr = (element_type *)&PTR___Sp_counted_ptr_inplace_0017a008;
          ((__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> *)
          &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14)[1]._vptr__Sp_counted_base)->
          _M_ptr = (element_type *)&PTR__SchemeObject_0017a638;
          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14)[1]._M_use_count)->_M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x5;
          local_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
          local_38->_M_use_count = 1;
          local_38->_M_weak_count = 1;
          local_38->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0017a008;
          local_40 = local_38 + 1;
          local_38[1]._vptr__Sp_counted_base = (_func_int **)&PTR__SchemeObject_0017a638;
          local_38[1]._M_use_count = 6;
          local_38[1]._M_weak_count = 0;
          cVar8 = (*(code *)((__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> *)
                            &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14)[1].
                             _vptr__Sp_counted_base)->_M_ptr[6]._vptr_SchemeObject)();
          if (cVar8 == '\0') {
            local_e0[0] = local_d0;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"8","");
            evaluate_string_in_global_context((string *)local_c0);
            local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
            local_48->_M_use_count = 1;
            local_48->_M_weak_count = 1;
            local_48->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0017a008;
            local_50 = local_48 + 1;
            local_48[1]._vptr__Sp_counted_base = (_func_int **)&PTR__SchemeObject_0017a638;
            local_48[1]._M_use_count = 8;
            local_48[1]._M_weak_count = 0;
            bVar9 = (**(code **)(*(long *)local_c0._0_8_ + 0x30))(local_c0._0_8_);
            bVar9 = bVar9 ^ 1;
            bVar6 = true;
            bVar5 = true;
            bVar4 = true;
            bVar3 = true;
            goto LAB_001148cf;
          }
          bVar5 = true;
          bVar4 = true;
        }
        else {
          bVar5 = false;
LAB_00116b93:
          bVar4 = false;
        }
        bVar6 = true;
        bVar3 = false;
        bVar9 = 1;
        goto LAB_001148cf;
      }
    }
  }
  bVar6 = false;
  bVar5 = false;
  bVar4 = false;
  bVar3 = false;
LAB_001148cf:
  if (bVar3) {
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
    if (bVar3) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_);
      }
      if (local_e0[0] != local_d0) {
        operator_delete(local_e0[0],local_d0[0] + 1);
      }
    }
  }
  if (bVar4) {
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if ((bVar4) &&
       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14);
    }
  }
  if (bVar5) {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
    }
    if ((long *)local_b0._M_allocated_capacity != local_a0) {
      operator_delete((void *)local_b0._M_allocated_capacity,local_a0[0] + 1);
    }
  }
  if (bVar6) {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._24_8_);
    }
    if ((long *)local_70._M_allocated_capacity != local_60) {
      operator_delete((void *)local_70._M_allocated_capacity,local_60[0] + 1);
    }
  }
  if (bVar9 == 0) {
    paVar1 = &local_100.field_2;
    local_120._M_dataplus._M_p = (pointer)0x3e;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    paVar2 = &local_120.field_2;
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_100._M_dataplus._M_p,
                    "(define x 1) (define (f x) (g 2)) (define (g y) (+ x y)) (f 5)",0x3e);
    local_100._M_string_length = (size_type)local_120._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_120._M_dataplus._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x33;
    local_120._M_string_length = 1;
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x58;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    pcVar11 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    _Var7._M_p = local_120._M_dataplus._M_p;
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    local_100._M_dataplus._M_p = pcVar11;
    memcpy(pcVar11,
           "(equal? (list #t #f true false (if #t 1 2) (if #f 1 2) (if 0 1 2)) \'(#t #f #t #f 1 2 1))"
           ,0x58);
    local_100._M_string_length = (size_type)_Var7._M_p;
    pcVar11[_Var7._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x25;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_100._M_dataplus._M_p,"(equal? \'(8 . (13 . ())) (list 8 13))",0x25);
    local_100._M_string_length = (size_type)local_120._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_120._M_dataplus._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x18;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_100._M_dataplus._M_p,"\n(define\tx 5 )(+\tx  2)  ",0x18);
    local_100._M_string_length = (size_type)local_120._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_120._M_dataplus._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x370a;
    local_120.field_2._M_local_buf[2] = '\n';
    local_120.field_2._M_local_buf[3] = '\0';
    local_120._M_string_length = 3;
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_100.field_2._M_allocated_capacity._0_2_ = 0x2827;
    local_100.field_2._M_local_buf[2] = ')';
    local_100.field_2._M_local_buf[3] = '\'';
    local_100.field_2._M_local_buf[4] = '(';
    local_100.field_2._M_allocated_capacity._5_2_ = 0x2229;
    local_100.field_2._M_local_buf[7] = 'q';
    local_100.field_2._8_4_ = 0x29286022;
    local_100.field_2._M_local_buf[0xc] = ';';
    local_100._M_string_length = 0xd;
    local_100.field_2._M_local_buf[0xd] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x696e;
    local_120.field_2._M_local_buf[2] = 'l';
    local_120.field_2._M_local_buf[3] = ';';
    local_120.field_2._M_local_buf[4] = 't';
    local_120.field_2._M_local_buf[5] = '\0';
    local_120._M_string_length = 5;
    local_120._M_dataplus._M_p = (pointer)paVar2;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x3f;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_100._M_dataplus._M_p,
                    "(define name \"max\")(equal? (list\"Hi\"name(+ 1 2)) \'(\"Hi\"\"max\"3))",0x3f)
    ;
    local_100._M_string_length = (size_type)local_120._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_120._M_dataplus._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x38;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_100._M_dataplus._M_p,
                    "(define lambda) (define + 5) (define <=?) (define a-b) +",0x38);
    local_100._M_string_length = (size_type)local_120._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_120._M_dataplus._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x35;
    local_120._M_string_length = 1;
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x12;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_100._M_dataplus._M_p,"(define fOO 5) Foo",0x12);
    local_100._M_string_length = (size_type)local_120._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_120._M_dataplus._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x35;
    local_120._M_string_length = 1;
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x10;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_100._M_dataplus._M_p,"(equal? #\\a #\\A)",0x10);
    local_100._M_string_length = (size_type)local_120._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_120._M_dataplus._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x6623;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x14;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_100._M_dataplus._M_p,"(define x ; 5 \n 6) x",0x14);
    local_100._M_string_length = (size_type)local_120._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_120._M_dataplus._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x36;
    local_120._M_string_length = 1;
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x11;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_100._M_dataplus._M_p,"((if #f = *) 3 4)",0x11);
    local_100._M_string_length = (size_type)local_120._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_120._M_dataplus._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x13;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_100._M_dataplus._M_p,"[+ 2 (+ 3 [+ 4 5])]",0x13);
    local_100._M_string_length = (size_type)local_120._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_120._M_dataplus._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x3431;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_100.field_2._M_allocated_capacity._0_2_ = 0x2d28;
    local_100.field_2._M_local_buf[2] = ' ';
    local_100.field_2._M_local_buf[3] = '0';
    local_100.field_2._M_local_buf[4] = ' ';
    local_100.field_2._M_allocated_capacity._5_2_ = 0x2935;
    local_100._M_string_length = 7;
    local_100.field_2._M_local_buf[7] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x352d;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_100.field_2._M_allocated_capacity._0_2_ = 0x352b;
    local_100._M_string_length = 2;
    local_100.field_2._M_local_buf[2] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x35;
    local_120._M_string_length = 1;
    local_120._M_dataplus._M_p = (pointer)paVar2;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_100.field_2._M_allocated_capacity._0_2_ = 0x352b;
    local_100.field_2._M_local_buf[2] = '.';
    local_100.field_2._M_local_buf[3] = '0';
    local_100._M_string_length = 4;
    local_100.field_2._M_local_buf[4] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x2e35;
    local_120.field_2._M_local_buf[2] = '0';
    local_120.field_2._M_local_buf[3] = '\0';
    local_120._M_string_length = 3;
    local_120._M_dataplus._M_p = (pointer)paVar2;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_100.field_2._M_allocated_capacity._0_2_ = 0x352b;
    local_100.field_2._M_local_buf[2] = '/';
    local_100.field_2._M_local_buf[3] = '2';
    local_100._M_string_length = 4;
    local_100.field_2._M_local_buf[4] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x2e32;
    local_120.field_2._M_local_buf[2] = '5';
    local_120.field_2._M_local_buf[3] = '\0';
    local_120._M_string_length = 3;
    local_120._M_dataplus._M_p = (pointer)paVar2;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    test_special_forms();
    local_120._M_dataplus._M_p = (pointer)0x15e;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    pcVar11 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    _Var7._M_p = local_120._M_dataplus._M_p;
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    local_100._M_dataplus._M_p = pcVar11;
    memcpy(pcVar11,
           "(define (f x) (+ x x)) (define l \'(1 2 q)) (define p (cons car cdr)) (define v \'#(1 2 q)) (define s \"qwerty\") (define c (make-cell 5)) (define wp (weak-cons 42 37)) (and (eq? #t #t) (eq? #f #f) (eq? \'QWE \'Qwe) (eq? 7 7) (eq? 4.6 4.6) (eq? #\\o #\\o) (eq? cons cons) (eq? \'() \'()) (eq? f f) (eq? l l) (eq? p p) (eq? v v) (eq? s s) (eq? c c) (eq? wp wp))"
           ,0x15e);
    local_100._M_string_length = (size_type)_Var7._M_p;
    pcVar11[_Var7._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0xf2;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    pcVar11 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    _Var7._M_p = local_120._M_dataplus._M_p;
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    local_100._M_dataplus._M_p = pcVar11;
    memcpy(pcVar11,
           "(or (eq? \'(5 5) \'kek) (eq? #t #f) (eq? \'q \'w) (eq? 4 4.0) (eq? 4 5) (eq? 4.5 5.4) (eq? #\\A #\\B) (eq? \'() \'(())) (eq? (lambda x x) (lambda x 0)) (eq? (cons 1 1) (cons 1 1)) (eq? \'#() \'#()) (eq? \"qw\" \"qw\") (eq? (make-cell \'()) (make-cell \'())))"
           ,0xf2);
    local_100._M_string_length = (size_type)_Var7._M_p;
    pcVar11[_Var7._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x6623;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x72;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    pcVar11 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    _Var7._M_p = local_120._M_dataplus._M_p;
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    local_100._M_dataplus._M_p = pcVar11;
    memcpy(pcVar11,
           "(define gen-counter (lambda () (let ((n 0)) (lambda () (set! n (+ n 1)) n)))) (let ((g (gen-counter))) (eqv? g g))"
           ,0x72);
    local_100._M_string_length = (size_type)_Var7._M_p;
    pcVar11[_Var7._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x70;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    pcVar11 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    _Var7._M_p = local_120._M_dataplus._M_p;
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    local_100._M_dataplus._M_p = pcVar11;
    memcpy(pcVar11,
           "(define gen-counter (lambda () (let ((n 0)) (lambda () (set! n (+ n 1)) n)))) (eqv? (gen-counter) (gen-counter))"
           ,0x70);
    local_100._M_string_length = (size_type)_Var7._M_p;
    pcVar11[_Var7._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x6623;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x79;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    pcVar11 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    _Var7._M_p = local_120._M_dataplus._M_p;
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    local_100._M_dataplus._M_p = pcVar11;
    memcpy(pcVar11,
           "(and (equal? \'a \'a) (equal? \'(a) \'(a)) (equal? \'(a (b) \"c\") \'(a (b) \"c\")) (equal? (make-vector 5 \'a) (make-vector 5 \'a)))"
           ,0x79);
    local_100._M_string_length = (size_type)_Var7._M_p;
    pcVar11[_Var7._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x87;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    pcVar11 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    _Var7._M_p = local_120._M_dataplus._M_p;
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    local_100._M_dataplus._M_p = pcVar11;
    memcpy(pcVar11,
           "(or (equal? \'a \'b) (equal? \'a \'(a)) (equal? \'(a (b) \"c\") \'((b) a \"c\")) (equal? (make-vector 5 \'a) (make-vector 6 \'a)) (equal? \"a\" \"A\"))"
           ,0x87);
    local_100._M_string_length = (size_type)_Var7._M_p;
    pcVar11[_Var7._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x6623;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0xb3;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    pcVar11 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    _Var7._M_p = local_120._M_dataplus._M_p;
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    local_100._M_dataplus._M_p = pcVar11;
    memcpy(pcVar11,
           "(equal? (list (number? 5) (number? 5.) (number? #\\5) (exact? 5) (exact? 5.) (inexact? 5) (inexact? 5.) (integer? 5) (integer? 5.) (integer? 5.5)) \'(#t #t #f #t #f #f #t #t #t #f))"
           ,0xb3);
    local_100._M_string_length = (size_type)_Var7._M_p;
    pcVar11[_Var7._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0xc2;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    pcVar11 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    _Var7._M_p = local_120._M_dataplus._M_p;
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    local_100._M_dataplus._M_p = pcVar11;
    memcpy(pcVar11,
           "(equal? (list (< 1 2) (<= 1 2) (> 1 2) (>= 1 2) (= 1 2) (< 2 1) (<= 2 1) (> 2 1) (>= 2 1) (= 2 1) (< 2 2.) (<= 2 2.) (> 2 2.) (>= 2 2.) (= 2 2.)) \'(#t #t #f #f #f #f #f #t #t #f #f #t #f #t #t))"
           ,0xc2);
    local_100._M_string_length = (size_type)_Var7._M_p;
    pcVar11[_Var7._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x80;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    pcVar11 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    _Var7._M_p = local_120._M_dataplus._M_p;
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    local_100._M_dataplus._M_p = pcVar11;
    memcpy(pcVar11,
           "(equal? (list (zero? 5) (positive? 5) (negative? 5) (zero? -5) (positive? -5) (negative? -5) (zero? 0)) \'(#f #t #f #f #f #t #t))"
           ,0x80);
    local_100._M_string_length = (size_type)_Var7._M_p;
    pcVar11[_Var7._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x8b;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    pcVar11 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    _Var7._M_p = local_120._M_dataplus._M_p;
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    local_100._M_dataplus._M_p = pcVar11;
    memcpy(pcVar11,
           "(equal? (list (+ 3 4 5) (+ 3 4) (+ 3) (+) (* 3 4 5) (* 3 4) (* 3) (*) (- 3 4 5) (- 3 4) (- 3) (/ 3 4)) \'(12 7 3 0 60 12 3 1 -6 -1 -3 0.75))"
           ,0x8b);
    local_100._M_string_length = (size_type)_Var7._M_p;
    pcVar11[_Var7._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_100.field_2._M_allocated_capacity._0_2_ = 0x3128;
    local_100.field_2._M_local_buf[2] = '+';
    local_100.field_2._M_local_buf[3] = ' ';
    local_100.field_2._M_local_buf[4] = '(';
    local_100.field_2._M_allocated_capacity._5_2_ = 0x312d;
    local_100.field_2._M_local_buf[7] = '+';
    local_100.field_2._8_4_ = 0x29293520;
    local_100._M_string_length = 0xc;
    local_100.field_2._M_local_buf[0xc] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x35;
    local_120._M_string_length = 1;
    local_120._M_dataplus._M_p = (pointer)paVar2;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x10c;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    pcVar11 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    _Var7._M_p = local_120._M_dataplus._M_p;
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    local_100._M_dataplus._M_p = pcVar11;
    memcpy(pcVar11,
           "(equal? (list (abs 3) (abs -3) (quotient 13 4) (modulo 13 4) (remainder 13 4) (quotient -13 4) (modulo -13 4) (remainder -13 4) (quotient 13 -4) (modulo 13 -4) (remainder 13 -4)(quotient -13 -4) (modulo -13 -4) (remainder -13 -4)) \'(3 3 3 1 1 -3 3 -1 -3 -3 1 3 -1 -1))"
           ,0x10c);
    local_100._M_string_length = (size_type)_Var7._M_p;
    pcVar11[_Var7._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x17;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_100._M_dataplus._M_p,"(string->number \"13.5\")",0x17);
    local_100._M_string_length = (size_type)local_120._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_120._M_dataplus._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x3331;
    local_120.field_2._M_local_buf[2] = '.';
    local_120.field_2._M_local_buf[3] = '5';
    local_120._M_string_length = 4;
    local_120.field_2._M_local_buf[4] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x15;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_100._M_dataplus._M_p,"(string->number \"13\")",0x15);
    local_100._M_string_length = (size_type)local_120._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_120._M_dataplus._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x3331;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x21;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_100._M_dataplus._M_p,"(equal? (number->string 13) \"13\")",0x21);
    local_100._M_string_length = (size_type)local_120._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_120._M_dataplus._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x10;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_100._M_dataplus._M_p,"(rational? -2/3)",0x10);
    local_100._M_string_length = (size_type)local_120._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_120._M_dataplus._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_100.field_2._M_allocated_capacity._0_2_ = 0x2f35;
    local_100.field_2._M_local_buf[2] = '2';
    local_100.field_2._M_local_buf[3] = '\0';
    local_100._M_string_length = 3;
    local_120.field_2._M_allocated_capacity._0_2_ = 0x2e32;
    local_120.field_2._M_local_buf[2] = '5';
    local_120.field_2._M_local_buf[3] = '\0';
    local_120._M_string_length = 3;
    local_120._M_dataplus._M_p = (pointer)paVar2;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    test_strings();
    test_lists();
    local_120._M_dataplus._M_p = (pointer)0x29;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_100._M_dataplus._M_p,"(equal? (make-vector 5 \'a) \'#(a a a a a))",0x29);
    local_100._M_string_length = (size_type)local_120._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_120._M_dataplus._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x1e;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_100._M_dataplus._M_p,"(equal? (vector 5 \'a) \'#(5 a))",0x1e);
    local_100._M_string_length = (size_type)local_120._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_120._M_dataplus._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0xc5;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    pcVar11 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    _Var7._M_p = local_120._M_dataplus._M_p;
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    local_100._M_dataplus._M_p = pcVar11;
    memcpy(pcVar11,
           "(define a (list->vector \'(1 2 3))) (define b a) (define c (vector-copy a)) (vector-set! a 0 0) (equal? (list (eq? a b) (eq? a c) (vector-ref b 0) (vector-ref c 0) (vector-length b)) \'(#t #f 0 1 3))"
           ,0xc5);
    local_100._M_string_length = (size_type)_Var7._M_p;
    pcVar11[_Var7._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x48;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    pcVar11 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    _Var7._M_p = local_120._M_dataplus._M_p;
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    local_100._M_dataplus._M_p = pcVar11;
    memcpy(pcVar11,"(equal? (make-initialized-vector 5 (lambda (x) (* x x))) \'#(0 1 4 9 16))",0x48)
    ;
    local_100._M_string_length = (size_type)_Var7._M_p;
    pcVar11[_Var7._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x29;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_100._M_dataplus._M_p,"(vector-length (vector-grow \'#(1 2 3) 5))",0x29);
    local_100._M_string_length = (size_type)local_120._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_120._M_dataplus._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x35;
    local_120._M_string_length = 1;
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x3a;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_100._M_dataplus._M_p,
                    "(equal? (vector-map cadr \'#((a b) (d e) (g h))) \'#(b e h))",0x3a);
    local_100._M_string_length = (size_type)local_120._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_120._M_dataplus._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x24;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_100._M_dataplus._M_p,"(vector-ref \'#(1 1 2 3 5 8 13 21) 5)",0x24);
    local_100._M_string_length = (size_type)local_120._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_120._M_dataplus._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x38;
    local_120._M_string_length = 1;
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x75;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    pcVar11 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    _Var7._M_p = local_120._M_dataplus._M_p;
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    local_100._M_dataplus._M_p = pcVar11;
    memcpy(pcVar11,
           "(equal? (let ((vec (vector 0 \'(2 2 2 2) \"Anna\"))) (vector-set! vec 1 \'(\"Sue\" \"Sue\")) vec) \'#(0 (\"Sue\" \"Sue\") \"Anna\"))"
           ,0x75);
    local_100._M_string_length = (size_type)_Var7._M_p;
    pcVar11[_Var7._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x30;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_100._M_dataplus._M_p,"(equal? (subvector \'#(0 1 2 3 4 5) 2 4) \'#(2 3))",
                    0x30);
    local_100._M_string_length = (size_type)local_120._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_120._M_dataplus._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x30;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_100._M_dataplus._M_p,"(equal? (vector-head \'#(0 1 2 3 4 5) 2) \'#(0 1))",
                    0x30);
    local_100._M_string_length = (size_type)local_120._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_120._M_dataplus._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x34;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_100._M_dataplus._M_p,
                    "(equal? (vector-tail \'#(0 1 2 3 4 5) 2) \'#(2 3 4 5))",0x34);
    local_100._M_string_length = (size_type)local_120._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_120._M_dataplus._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x4c;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    pcVar11 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    _Var7._M_p = local_120._M_dataplus._M_p;
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    local_100._M_dataplus._M_p = pcVar11;
    memcpy(pcVar11,"(define v \'#(0 1 2 3 4)) (subvector-fill! v 1 3 \'q) (equal? v \'#(0 q q 3 4))"
           ,0x4c);
    local_100._M_string_length = (size_type)_Var7._M_p;
    pcVar11[_Var7._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    test_misc();
    test_procedures();
    local_120._M_dataplus._M_p = (pointer)0x83;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    pcVar11 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    _Var7._M_p = local_120._M_dataplus._M_p;
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    local_100._M_dataplus._M_p = pcVar11;
    memcpy(pcVar11,
           "(and (port? console-i/o-port) (i/o-port? console-i/o-port) (input-port? (current-input-port)) (output-port? (current-output-port)))"
           ,0x83);
    local_100._M_string_length = (size_type)_Var7._M_p;
    pcVar11[_Var7._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x70;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    pcVar11 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    _Var7._M_p = local_120._M_dataplus._M_p;
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    local_100._M_dataplus._M_p = pcVar11;
    memcpy(pcVar11,
           "(define s (open-input-string \"qwe\\nrty\\nuio\")) (close-all-open-files) (read-line s) (equal? (read-line s) \"rty\")"
           ,0x70);
    local_100._M_string_length = (size_type)_Var7._M_p;
    pcVar11[_Var7._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x7a;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    pcVar11 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    _Var7._M_p = local_120._M_dataplus._M_p;
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    local_100._M_dataplus._M_p = pcVar11;
    memcpy(pcVar11,
           "(define s (open-output-string)) (close-all-open-files) (display \'qwe s) (newline s) (equal? (get-output-string s) \"qwe\\n\")"
           ,0x7a);
    local_100._M_string_length = (size_type)_Var7._M_p;
    pcVar11[_Var7._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x41;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    pcVar11 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    _Var7._M_p = local_120._M_dataplus._M_p;
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    local_100._M_dataplus._M_p = pcVar11;
    memcpy(pcVar11,"(equal? (with-input-from-string \"(a b c) (d e f)\" read) \'(a b c))",0x41);
    local_100._M_string_length = (size_type)_Var7._M_p;
    pcVar11[_Var7._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x43;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    pcVar11 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    _Var7._M_p = local_120._M_dataplus._M_p;
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    local_100._M_dataplus._M_p = pcVar11;
    memcpy(pcVar11,"(equal? (call-with-output-string (lambda (p) (display 42 p))) \"42\")",0x43);
    local_100._M_string_length = (size_type)_Var7._M_p;
    pcVar11[_Var7._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0xbb;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    pcVar11 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    _Var7._M_p = local_120._M_dataplus._M_p;
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    local_100._M_dataplus._M_p = pcVar11;
    memcpy(pcVar11,
           "(define i (open-input-string \"qwe rty\")) (define o (open-output-string)) (set-current-input-port! i) (set-current-output-port! o) (write (read-char)) (equal? (get-output-string o) \"#\\\\q\")"
           ,0xbb);
    local_100._M_string_length = (size_type)_Var7._M_p;
    pcVar11[_Var7._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x3f;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_100._M_dataplus._M_p,
                    "(equal? (with-output-to-string (lambda () (write \'abc))) \"abc\")",0x3f);
    local_100._M_string_length = (size_type)local_120._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_120._M_dataplus._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x2e;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_100._M_dataplus._M_p,
                    "(equal? (write-to-string \"1 2 3\") \"\\\"1 2 3\\\"\")",0x2e);
    local_100._M_string_length = (size_type)local_120._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_120._M_dataplus._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x2f;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_100._M_dataplus._M_p,
                    "(equal? (write-to-string \'\'(a b c)) \"\'(a b c)\")",0x2f);
    local_100._M_string_length = (size_type)local_120._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_120._M_dataplus._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x35;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    local_100._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_100._M_dataplus._M_p,
                    "(equal? (write-to-string \'(quote . 1)) \"(quote . 1)\")",0x35);
    local_100._M_string_length = (size_type)local_120._M_dataplus._M_p;
    local_100._M_dataplus._M_p[(long)local_120._M_dataplus._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    local_120._M_dataplus._M_p = (pointer)0x8c;
    local_100._M_dataplus._M_p = (pointer)paVar1;
    pcVar11 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_100,(ulong)&local_120);
    _Var7._M_p = local_120._M_dataplus._M_p;
    local_100.field_2._M_allocated_capacity._0_2_ = SUB82(local_120._M_dataplus._M_p,0);
    local_100.field_2._M_local_buf[2] = (char)((ulong)local_120._M_dataplus._M_p >> 0x10);
    local_100.field_2._M_local_buf[3] = (char)((ulong)local_120._M_dataplus._M_p >> 0x18);
    local_100.field_2._M_local_buf[4] = (char)((ulong)local_120._M_dataplus._M_p >> 0x20);
    local_100.field_2._M_allocated_capacity._5_2_ =
         (undefined2)((ulong)local_120._M_dataplus._M_p >> 0x28);
    local_100.field_2._M_local_buf[7] = (char)((ulong)local_120._M_dataplus._M_p >> 0x38);
    local_100._M_dataplus._M_p = pcVar11;
    memcpy(pcVar11,
           "(equal? (with-input-from-string \"qw\" (lambda () (list (peek-char) (read-char) (read-char) (peek-char) (read-char)))) \'(#\\q #\\q #\\w eof eof))"
           ,0x8c);
    local_100._M_string_length = (size_type)_Var7._M_p;
    pcVar11[_Var7._M_p] = '\0';
    local_120.field_2._M_allocated_capacity._0_2_ = 0x7423;
    local_120._M_string_length = 2;
    local_120.field_2._M_local_buf[2] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar2;
    run_test(&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 CONCAT13(local_120.field_2._M_local_buf[3],
                                                          CONCAT12(local_120.field_2._M_local_buf[2]
                                                                   ,local_120.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT17(local_100.field_2._M_local_buf[7],
                               CONCAT25(local_100.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_100.field_2._M_local_buf[4],
                                                 CONCAT13(local_100.field_2._M_local_buf[3],
                                                          CONCAT12(local_100.field_2._M_local_buf[2]
                                                                   ,local_100.field_2.
                                                                    _M_allocated_capacity._0_2_)))))
                      + 1);
    }
    return 0;
  }
  poVar12 = std::operator<<((ostream *)&std::cout,"Something weird happened");
  std::endl<char,std::char_traits<char>>(poVar12);
  exit(1);
}

Assistant:

int main()
{
    if(scheme_true == scheme_false || scheme_true->is_eq(scheme_false) || scheme_false->is_eq(scheme_true) ||
       evaluate_string_in_global_context("#t") != scheme_true ||
       evaluate_string_in_global_context("#f") != scheme_false ||
       std::make_shared<SchemeInt>(5)->is_eq(std::make_shared<SchemeInt>(6)) ||
       !evaluate_string_in_global_context("8")->is_eq(std::make_shared<SchemeInt>(8)))
    {
        std::cout << "Something weird happened" << std::endl;
        exit(1);
    }
    test_basic();
    test_special_forms();
    test_equality();
    test_math();
    test_strings();
    test_lists();
    test_vectors();
    test_misc();
    test_procedures();
    test_io();
}